

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O0

void __thiscall
mognetwork::Packet::reinitialize(Packet *this,vector<char,_std::allocator<char>_> *data)

{
  void *pvVar1;
  vector<char,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0x10) = 0;
  if (*(long *)(in_RDI + 0x18) == 0) {
    if ((*(long *)(in_RDI + 8) != 0) && (pvVar1 = *(void **)(in_RDI + 8), pvVar1 != (void *)0x0)) {
      std::vector<char,_std::allocator<char>_>::~vector(in_RSI);
      operator_delete(pvVar1);
    }
  }
  else {
    pvVar1 = *(void **)(in_RDI + 0x18);
    if (pvVar1 != (void *)0x0) {
      TcpSocket::ReadedDatas::~ReadedDatas((ReadedDatas *)0x118b74);
      operator_delete(pvVar1);
    }
  }
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(vector<char,_std::allocator<char>_> **)(in_RDI + 8) = in_RSI;
  return;
}

Assistant:

void Packet::reinitialize(std::vector<char>* data)
  {
    m_readerPos = 0;
    if (m_dataPack != NULL)
      delete m_dataPack;
    else if (m_data != NULL)
      delete m_data;
    m_dataPack = NULL;
    m_data = data;    
  }